

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::CopyFrom
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this,TPZMatrix<double> *mat)

{
  TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *pTVar1;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    pTVar1 = (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *)
             __dynamic_cast(mat,&TPZMatrix<double>::typeinfo,
                            &TPZDohrPrecond<double,TPZDohrSubstructCondense<double>>::typeinfo,0);
    if (pTVar1 != (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *)0x0) {
      operator=(this,pTVar1);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZDohrPrecond<double, TPZDohrSubstructCondense<double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double, TSubStruct = TPZDohrSubstructCondense<double>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SubStruct/tpzdohrprecond.h"
             ,0x50);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }